

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

bool __thiscall Memory::SegmentBaseCommon::IsInPreReservedHeapPageAllocator(SegmentBaseCommon *this)

{
  return this->allocator->allocatorType == PreReservedVirtualAlloc;
}

Assistant:

bool SegmentBaseCommon::IsInPreReservedHeapPageAllocator() const
{
#if ENABLE_NATIVE_CODEGEN
    return allocator->GetAllocatorType() == PageAllocatorBaseCommon::AllocatorType::PreReservedVirtualAlloc
#if ENABLE_OOP_NATIVE_CODEGEN
        || allocator->GetAllocatorType() == PageAllocatorBaseCommon::AllocatorType::PreReservedSectionAlloc
#endif
#else
    return false
#endif
        ;
}